

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::RenderIndexBuffer::verify
          (RenderIndexBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  size_t pos;
  ulong uVar4;
  undefined1 *local_68;
  undefined1 *puStack_60;
  PixelBufferAccess local_58;
  
  for (uVar4 = 0; uVar3 = this->m_bufferSize >> 1, uVar4 < uVar3; uVar4 = uVar4 + 1) {
    bVar1 = *(byte *)(*(long *)(*(long *)ctx + 0x18) + uVar4 * 2);
    bVar2 = *(byte *)(*(long *)(*(long *)ctx + 0x18) + 1 + uVar4 * 2);
    tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
    local_68 = &DAT_3f8000003f800000;
    puStack_60 = &DAT_3f8000003f800000;
    tcu::PixelBufferAccess::setPixel(&local_58,(Vec4 *)&local_68,(uint)bVar1,(uint)bVar2,0);
  }
  return (int)uVar3;
}

Assistant:

void RenderIndexBuffer::verify (VerifyRenderPassContext& context, size_t)
{
	for (size_t pos = 0; pos < (size_t)m_bufferSize / 2; pos++)
	{
		const deUint8 x  = context.getReference().get(pos * 2);
		const deUint8 y  = context.getReference().get((pos * 2) + 1);

		context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), x, y);
	}
}